

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void fill_window(deflate_state *s)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  z_streamp_conflict pzVar4;
  Bytef *pBVar5;
  uint uVar6;
  ulong uVar7;
  ushort *puVar8;
  uLong uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  ulong __n;
  
  uVar1 = s->w_size;
  __n = (ulong)uVar1;
  do {
    uVar12 = (int)s->window_size - (s->lookahead + s->strstart);
    if (s->w_size + (uVar1 - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + __n,__n);
      s->match_start = s->match_start - uVar1;
      s->strstart = s->strstart - uVar1;
      s->block_start = s->block_start - __n;
      uVar7 = (ulong)s->hash_size;
      puVar8 = s->head + uVar7;
      do {
        puVar8 = puVar8 + -1;
        uVar10 = *puVar8 - (short)uVar1;
        if (*puVar8 < uVar1) {
          uVar10 = 0;
        }
        *puVar8 = uVar10;
        uVar6 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar6;
      } while (uVar6 != 0);
      puVar8 = s->prev + (__n - 1);
      uVar6 = uVar1;
      do {
        uVar10 = *puVar8 - (short)uVar1;
        if (*puVar8 < uVar1) {
          uVar10 = 0;
        }
        *puVar8 = uVar10;
        puVar8 = puVar8 + -1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      uVar12 = uVar12 + uVar1;
    }
    pzVar4 = s->strm;
    uVar6 = pzVar4->avail_in;
    if (uVar6 == 0) {
      return;
    }
    uVar11 = uVar12;
    if (uVar6 < uVar12) {
      uVar11 = uVar6;
    }
    uVar7 = (ulong)uVar11;
    if (uVar12 == 0) {
      uVar11 = 0;
    }
    else {
      uVar12 = s->strstart;
      uVar2 = s->lookahead;
      pBVar5 = s->window;
      pzVar4->avail_in = uVar6 - uVar11;
      iVar3 = pzVar4->state->wrap;
      if (iVar3 == 2) {
        uVar9 = cm_zlib_crc32(pzVar4->adler,pzVar4->next_in,uVar11);
LAB_00581320:
        pzVar4->adler = uVar9;
      }
      else if (iVar3 == 1) {
        uVar9 = cm_zlib_adler32(pzVar4->adler,pzVar4->next_in,uVar11);
        goto LAB_00581320;
      }
      memcpy(pBVar5 + (ulong)uVar2 + (ulong)uVar12,pzVar4->next_in,uVar7);
      pzVar4->next_in = pzVar4->next_in + uVar7;
      pzVar4->total_in = pzVar4->total_in + uVar7;
    }
    uVar11 = uVar11 + s->lookahead;
    s->lookahead = uVar11;
    if (2 < uVar11) {
      uVar12 = (uint)s->window[s->strstart];
      s->ins_h = uVar12;
      s->ins_h = ((uint)s->window[s->strstart + 1] ^ uVar12 << ((byte)s->hash_shift & 0x1f)) &
                 s->hash_mask;
    }
    if (0x105 < uVar11) {
      return;
    }
    if (s->strm->avail_in == 0) {
      return;
    }
  } while( true );
}

Assistant:

local void fill_window(s)
    deflate_state *s;
{
    register unsigned n, m;
    register Posf *p;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;

            /* Slide the hash table (could be avoided with 32 bit values
               at the expense of memory usage). We slide even when level == 0
               to keep the hash table consistent if we switch back to level > 0
               later. (Using level 0 permanently is not an optimal usage of
               zlib, so we don't care about this pathological case.)
             */
            /* %%% avoid this when Z_RLE */
            n = s->hash_size;
            p = &s->head[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
            } while (--n);

            n = wsize;
#ifndef FASTEST
            p = &s->prev[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
                /* If n is not on any hash chain, prev[n] is garbage but
                 * its value will never be used.
                 */
            } while (--n);
#endif
            more += wsize;
        }
        if (s->strm->avail_in == 0) return;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead >= MIN_MATCH) {
            s->ins_h = s->window[s->strstart];
            UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);
}